

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbrz.cpp
# Opt level: O1

void (anonymous_namespace)::Scaler2x<(anonymous_namespace)::ColorGradientARGB>::alphaGrad<5u,6u>
               (uint32_t *pixBack,uint32_t pixFront)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = *pixBack;
  iVar1 = (pixFront >> 0x18) * 5;
  uVar4 = uVar2 >> 0x18;
  uVar3 = uVar4 + iVar1;
  if (uVar3 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = ((uVar2 & 0xff) * uVar4 + (pixFront & 0xff) * iVar1) / uVar3 & 0xff |
            (((uVar2 >> 8 & 0xff) * uVar4 + (pixFront >> 8 & 0xff) * iVar1) / uVar3 & 0xff) << 8 |
            (((uVar2 >> 0x10 & 0xff) * uVar4 + (pixFront >> 0x10 & 0xff) * iVar1) / uVar3 & 0xff) <<
            0x10 | ((uint)((ulong)uVar3 * 0xaaaaaaab >> 0x20) & 0xfffffffc) << 0x16;
  }
  *pixBack = uVar2;
  return;
}

Assistant:

static void alphaGrad(uint32_t& pixBack, uint32_t pixFront)
    {
        pixBack = gradientARGB<M, N>(pixFront, pixBack);
    }